

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::append_attribute(xml_node *this,char_t *name_)

{
  xml_node_struct *node;
  uint uVar1;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar2;
  xml_attribute a;
  xml_attribute local_18;
  
  node = this->_root;
  if ((node == (xml_node_struct *)0x0) ||
     ((uVar1 = (uint)node->header & 7, uVar1 != 6 && (uVar1 != 1)))) {
    pxVar2 = (xml_attribute_struct *)0x0;
  }
  else {
    alloc = impl::anon_unknown_0::get_allocator(node);
    pxVar2 = impl::anon_unknown_0::append_attribute_ll(node,alloc);
    local_18._attr = pxVar2;
    xml_attribute::set_name(&local_18,name_);
  }
  return (xml_attribute)pxVar2;
}

Assistant:

PUGI__FN xml_node_type xml_node::type() const
	{
		return _root ? static_cast<xml_node_type>((_root->header & impl::xml_memory_page_type_mask) + 1) : node_null;
	}